

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O0

void Model::dHdx(double *ret,double *x,double *u,double *p,double *lmd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = *in_RSI;
  dVar2 = *in_RCX;
  dVar3 = in_R8[3];
  dVar4 = in_RSI[2];
  dVar5 = in_RSI[2];
  dVar6 = cos(*in_RSI - in_RSI[1]);
  dVar7 = sin(*in_RSI - in_RSI[1]);
  dVar10 = *in_RDX;
  dVar8 = sin(*in_RSI - in_RSI[1]);
  *in_RDI = (dVar1 - dVar2) +
            dVar3 * (-(dVar8 * 5.65635) * in_RSI[2] +
                    dVar4 * 0.905016 * dVar5 * dVar6 + dVar7 * 14.1183 * dVar10);
  dVar1 = in_RSI[1];
  dVar2 = in_RCX[1];
  dVar3 = in_R8[3];
  dVar4 = in_RSI[2];
  dVar5 = in_RSI[2];
  dVar6 = cos(*in_RSI - in_RSI[1]);
  dVar7 = cos(in_RSI[1]);
  dVar8 = sin(*in_RSI - in_RSI[1]);
  dVar10 = *in_RDX;
  dVar9 = sin(*in_RSI - in_RSI[1]);
  in_RDI[1] = (dVar1 - dVar2) +
              dVar3 * (dVar9 * 5.65635 * in_RSI[2] +
                      -(dVar8 * 14.1183) * dVar10 +
                      dVar4 * -0.905016 * dVar5 * dVar6 + dVar7 * 39.1111);
  dVar1 = in_RSI[2];
  dVar2 = *in_R8;
  dVar3 = in_R8[2];
  dVar4 = in_R8[3];
  dVar5 = in_RSI[2];
  dVar10 = sin(*in_RSI - in_RSI[1]);
  dVar6 = cos(*in_RSI - in_RSI[1]);
  in_RDI[2] = dVar4 * (dVar5 * 1.810032 * dVar10 + dVar6 * 5.65635 + 0.0407448) +
              -dVar3 * 6.25 + dVar1 * 0.0 + dVar2;
  in_RDI[3] = -in_R8[3] * 0.0407448 + in_RSI[3] * 0.0 + in_R8[1];
  return;
}

Assistant:

static void dHdx(double* ret, const double* x, const double* u, const double* p, const double* lmd) {
    ret[0] = (x[0] - p[0]) * q0 + lmd[3] * (A32 * x[2] * x[2] * cos(x[0] - x[1]) + A32b * sin(x[0] - x[1]) * u[0] - A32a * sin(x[0] - x[1]) * x[2]);
    ret[1] = (x[1] - p[1]) * q1 + lmd[3] * (-A32 * x[2] * x[2] * cos(x[0] - x[1]) + A52 * cos(x[1]) - A32b * sin(x[0] - x[1]) * u[0] + A32a * sin(x[0] - x[1]) * x[2]);
    ret[2] = x[2] * q2 + lmd[0] - lmd[2] * As + lmd[3] * (0.2e1 * A32 * x[2] * sin(x[0] - x[1]) + A32a * cos(x[0] - x[1]) + C22);
    ret[3] = x[3] * q3 + lmd[1] - lmd[3] * C22;
  }